

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void qlist_read(t_qlist *x,t_symbol *filename,t_symbol *format)

{
  int iVar1;
  int local_24;
  int cr;
  t_symbol *format_local;
  t_symbol *filename_local;
  t_qlist *x_local;
  
  local_24 = 0;
  iVar1 = strcmp(format->s_name,"cr");
  if (iVar1 == 0) {
    local_24 = 1;
  }
  else if (*format->s_name != '\0') {
    pd_error(x,"qlist_read: unknown flag: %s",format->s_name);
  }
  iVar1 = binbuf_read_via_canvas
                    ((x->x_textbuf).b_binbuf,filename->s_name,(x->x_textbuf).b_canvas,local_24);
  if (iVar1 != 0) {
    pd_error(x,"%s: read failed",filename->s_name);
  }
  x->x_onset = 0x7fffffff;
  x->x_rewound = 1;
  return;
}

Assistant:

static void qlist_read(t_qlist *x, t_symbol *filename, t_symbol *format)
{
    int cr = 0;
    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(x, "qlist_read: unknown flag: %s", format->s_name);

    if (binbuf_read_via_canvas(x->x_binbuf, filename->s_name, x->x_canvas, cr))
            pd_error(x, "%s: read failed", filename->s_name);
    x->x_onset = 0x7fffffff;
    x->x_rewound = 1;
}